

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O0

int MPLSParser::composeUHD_metadata(uint8_t *buffer,int bufferSize)

{
  int iVar1;
  uint i;
  uint *__end1;
  uint *__begin1;
  uint (*__range1) [6];
  undefined1 local_40 [8];
  BitStreamWriter writer;
  int bufferSize_local;
  uint8_t *buffer_local;
  
  writer.m_bitWrited = bufferSize;
  BitStreamWriter::BitStreamWriter((BitStreamWriter *)local_40);
  BitStreamWriter::setBuffer((BitStreamWriter *)local_40,buffer,buffer + (int)writer.m_bitWrited);
  BitStreamWriter::putBits((BitStreamWriter *)local_40,0x20,0x20);
  BitStreamWriter::putBits((BitStreamWriter *)local_40,0x20,0x1000000);
  BitStreamWriter::putBits((BitStreamWriter *)local_40,0x20,0x10000000);
  for (__end1 = HDR10_metadata; __end1 != (uint *)&std::__ioinit; __end1 = __end1 + 1) {
    BitStreamWriter::putBits((BitStreamWriter *)local_40,0x20,*__end1);
  }
  BitStreamWriter::flushBits((BitStreamWriter *)local_40);
  iVar1 = BitStreamWriter::getBitsCount((BitStreamWriter *)local_40);
  return iVar1 / 8;
}

Assistant:

int MPLSParser::composeUHD_metadata(uint8_t* buffer, const int bufferSize)
{
    BitStreamWriter writer{};
    writer.setBuffer(buffer, buffer + bufferSize);
    try
    {
        writer.putBits(32, 0x20);
        writer.putBits(32, 1 << 24);
        writer.putBits(32, 1 << 28);
        for (const unsigned i : HDR10_metadata) writer.putBits(32, i);
        writer.flushBits();
        return writer.getBitsCount() / 8;
    }
    catch (...)
    {
        return 0;
    }
}